

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_header.c
# Opt level: O3

void cmime_header_free(CMimeHeader_T *header)

{
  ulong uVar1;
  ulong uVar2;
  
  if (header != (CMimeHeader_T *)0x0) {
    if (header->name != (char *)0x0) {
      free(header->name);
    }
    uVar1 = header->count;
    if (uVar1 != 0) {
      uVar2 = 0;
      do {
        if (header->value[uVar2] != (char *)0x0) {
          free(header->value[uVar2]);
          uVar1 = header->count;
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 < uVar1);
    }
    free(header->value);
    free(header);
    return;
  }
  __assert_fail("header",
                "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_header.c"
                ,0x28,"void cmime_header_free(CMimeHeader_T *)");
}

Assistant:

void cmime_header_free(CMimeHeader_T *header) {
    size_t i;
    assert(header);


    if (header->name != NULL)
        free(header->name);
        
    for(i = 0; i < header->count; i++) {
        if (header->value[i] != NULL) 
            free(header->value[i]);
    } 
    free(header->value);
    header->value = NULL;
    free(header); 
}